

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.hh
# Opt level: O0

void __thiscall
avro::ReaderImpl<avro::Validator>::readValue(ReaderImpl<avro::Validator> *this,double *val)

{
  undefined8 *in_RSI;
  BufferReader *in_RDI;
  anon_union_8_2_94730066 v;
  Type in_stack_000000ec;
  Validator *in_stack_000000f0;
  unsigned_long *in_stack_ffffffffffffffd8;
  undefined8 local_18;
  
  Validator::checkTypeExpected(in_stack_000000f0,in_stack_000000ec);
  BufferReader::read<unsigned_long>(in_RDI,in_stack_ffffffffffffffd8);
  *in_RSI = local_18;
  return;
}

Assistant:

void readValue(double &val) {
        validator_.checkTypeExpected(AVRO_DOUBLE);
        union { 
            double d;
            uint64_t i;
        } v;
        reader_.read(v.i);
        val = v.d;
    }